

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O1

TIntermTyped * __thiscall
glslang::HlslParseContext::handleLvalue
          (HlslParseContext *this,TSourceLoc *loc,char *op,TIntermTyped **node)

{
  uint uVar1;
  TOperator op_00;
  TIntermediate *pTVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 extraout_var;
  HlslParseContext *pHVar7;
  TIntermNode *node_00;
  undefined4 extraout_var_02;
  long *plVar8;
  undefined4 extraout_var_04;
  long *plVar9;
  long lVar10;
  TIntermTyped *pTVar11;
  undefined4 extraout_var_05;
  TSampler *sampler;
  TIntermAggregate *extraout_RAX;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  long lVar12;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  TIntermSymbol *pTVar13;
  undefined4 extraout_var_10;
  TIntermBinary *pTVar14;
  TPoolAllocator *pTVar15;
  TIntermAggregate *pTVar16;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  TIntermSymbol *pTVar17;
  TType *type;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  TIntermAggregate *pTVar18;
  undefined4 extraout_var_20;
  TIntermUnary *pTVar19;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  TIntermSymbol *pTVar20;
  undefined4 extraout_var_27;
  ulong uVar21;
  char *pcVar22;
  char *pcVar23;
  TIntermTyped **ppTVar24;
  undefined1 *puVar25;
  uint uVar26;
  HlslParseContext *pHVar27;
  char *pcVar28;
  uint uVar29;
  long lVar30;
  TSourceLoc *pTVar31;
  TIntermAggregate *sequence;
  anon_class_24_3_d1780b14 makeStore;
  TType objDerefType;
  TIntermAggregate *local_160;
  undefined8 local_158;
  TIntermSymbol *local_150;
  TSourceLoc *local_148;
  HlslParseContext *local_140;
  TIntermTyped *local_138;
  HlslParseContext *local_130;
  TIntermSymbol *local_128;
  TIntermSymbol *local_120;
  TIntermSymbol *local_118;
  char *local_110;
  TIntermTyped **local_108;
  uint local_fc;
  long *local_f8;
  TIntermAggregate *local_f0;
  TIntermNode *local_e8;
  anon_class_24_3_d1780b14 local_e0;
  TType local_c8;
  HlslParseContext *pHVar6;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_03;
  
  puVar25 = &stack0xfffffffffffffe98;
  if (*node == (TIntermTyped *)0x0) {
    return (TIntermTyped *)0x0;
  }
  iVar4 = (*((*node)->super_TIntermNode)._vptr_TIntermNode[8])();
  pHVar6 = (HlslParseContext *)CONCAT44(extraout_var,iVar4);
  pHVar27 = (HlslParseContext *)*node;
  iVar4 = (*(pHVar27->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[7])();
  pHVar7 = (HlslParseContext *)CONCAT44(extraout_var_00,iVar4);
  local_160 = (TIntermAggregate *)0x0;
  local_130 = pHVar7;
  if (pHVar7 == (HlslParseContext *)0x0) {
    if (pHVar6 == (HlslParseContext *)0x0) {
      node_00 = (TIntermNode *)0x0;
    }
    else {
      pHVar27 = pHVar6;
      iVar4 = (*(pHVar6->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x32])()
      ;
      node_00 = (TIntermNode *)CONCAT44(extraout_var_02,iVar4);
    }
  }
  else {
    iVar4 = (*(pHVar7->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x31])();
    node_00 = (TIntermNode *)CONCAT44(extraout_var_01,iVar4);
    pHVar27 = pHVar7;
  }
  bVar3 = shouldConvertLValue(pHVar27,node_00);
  if (!bVar3) {
    if ((node_00 != (TIntermNode *)0x0) &&
       (iVar4 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x42])
                          (this,loc,op,node_00), (char)iVar4 != '\0')) {
      return (TIntermTyped *)0x0;
    }
    return *node;
  }
  local_e0.sequence = &local_160;
  local_148 = loc;
  local_110 = op;
  local_e0.this = this;
  local_e0.loc = loc;
  iVar4 = (*node_00->_vptr_TIntermNode[8])(node_00);
  plVar8 = (long *)CONCAT44(extraout_var_03,iVar4);
  local_e8 = node_00;
  iVar4 = (*node_00->_vptr_TIntermNode[6])(node_00);
  plVar9 = (long *)CONCAT44(extraout_var_04,iVar4);
  local_108 = node;
  if ((plVar8 == (long *)0x0) || (((int)plVar8[0x17] != 0x36 && ((int)plVar8[0x17] != 0x33)))) {
    bVar3 = false;
  }
  else {
    plVar9 = (long *)(**(code **)(*plVar8 + 400))(plVar8);
    plVar9 = (long *)(**(code **)(*plVar9 + 0x30))(plVar9);
    bVar3 = true;
  }
  lVar10 = (**(code **)(*plVar9 + 400))(plVar9);
  pTVar11 = (TIntermTyped *)(**(code **)(*(long *)**(undefined8 **)(lVar10 + 8) + 0x18))();
  lVar10 = (**(code **)(*plVar9 + 400))(plVar9);
  local_120 = (TIntermSymbol *)(**(code **)(**(long **)(*(long *)(lVar10 + 8) + 8) + 0x18))();
  local_138 = pTVar11;
  iVar4 = (*(pTVar11->super_TIntermNode)._vptr_TIntermNode[0x1e])(pTVar11);
  sampler = (TSampler *)
            (**(code **)(*(long *)CONCAT44(extraout_var_05,iVar4) + 0x40))
                      ((long *)CONCAT44(extraout_var_05,iVar4));
  TType::TType(&local_c8,EbtVoid,EvqTemporary,1,0,0,false);
  local_140 = this;
  getTextureReturnType(this,sampler,&local_c8);
  pTVar18 = extraout_RAX;
  if (pHVar6 != (HlslParseContext *)0x0) {
    iVar4 = (*(pHVar6->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x33])
                      (pHVar6);
    pTVar18 = (TIntermAggregate *)CONCAT44(extraout_var_06,iVar4);
    uVar1 = *(uint *)&(pHVar6->super_TParseContextBase).super_TParseVersions.spvUnsupportedExt.
                      super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                      .
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
    uVar29 = uVar1 - 0x1df;
    if (uVar29 < 0xf) {
      uVar26 = 0x7ffe >> ((byte)uVar29 & 0x1f);
      local_128 = (TIntermSymbol *)(ulong)uVar1;
      iVar4 = (*(pTVar18->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0xc])(pTVar18);
      local_150 = (TIntermSymbol *)CONCAT44(extraout_var_07,iVar4);
      if ((bVar3 || local_150 == (TIntermSymbol *)0x0) || (pTVar17 = local_120, (uVar26 & 1) != 0))
      {
        local_f0 = pTVar18;
        local_150 = makeInternalVariableNode(local_140,local_148,"storeTemp",&local_c8);
        if (plVar8 != (long *)0x0) {
          local_158 = (TIntermSymbol *)((ulong)local_158 & 0xffffffff00000000);
          plVar9 = (long *)(**(code **)(*plVar8 + 0x198))(plVar8);
          lVar10 = (**(code **)(*plVar9 + 0x28))(plVar9);
          plVar9 = (long *)(**(code **)(*plVar8 + 0x198))(plVar8);
          plVar9 = (long *)(**(code **)(*plVar9 + 0x30))(plVar9);
          if (lVar10 == 0) {
            if (plVar9 == (long *)0x0) {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                            ,0x15b,
                            "auto glslang::HlslParseContext::handleLvalue(const TSourceLoc &, const char *, TIntermTyped *&)::(anonymous class)::operator()(TIntermSymbol *, TIntermBinary *) const"
                           );
            }
            lVar12 = (**(code **)(*plVar9 + 0x198))(plVar9);
            lVar10 = *(long *)(lVar12 + 8);
            if (0 < (int)((ulong)(*(long *)(lVar12 + 0x10) - lVar10) >> 3)) {
              lVar30 = 0;
              do {
                lVar10 = (**(code **)(**(long **)(lVar10 + lVar30 * 8) + 0x28))();
                *(undefined1 *)((long)&local_158 + (long)**(int **)(*(long *)(lVar10 + 0xc0) + 8)) =
                     1;
                lVar30 = lVar30 + 1;
                lVar10 = *(long *)(lVar12 + 8);
              } while (lVar30 < (int)((ulong)(*(long *)(lVar12 + 0x10) - lVar10) >> 3));
            }
          }
          else {
            *(undefined1 *)((long)&local_158 + (long)**(int **)(*(long *)(lVar10 + 0xc0) + 8)) = 1;
          }
          iVar4 = (*(local_150->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])();
          iVar4 = (**(code **)(*(long *)CONCAT44(extraout_var_08,iVar4) + 0x60))
                            ((long *)CONCAT44(extraout_var_08,iVar4));
          uVar21 = (ulong)iVar4;
          pcVar28 = (char *)((long)&local_158 + uVar21);
          if (0 < (long)uVar21 >> 2) {
            puVar25 = &stack0xfffffffffffffe98 + (uVar21 & 0xfffffffffffffffc);
            lVar10 = ((long)uVar21 >> 2) + 1;
            pcVar23 = (char *)((long)&local_158 + 3);
            do {
              if (pcVar23[-3] != '\x01') {
                pcVar23 = pcVar23 + -3;
                goto LAB_0037ec2a;
              }
              if (pcVar23[-2] != '\x01') {
                pcVar23 = pcVar23 + -2;
                goto LAB_0037ec2a;
              }
              if (pcVar23[-1] != '\x01') {
                pcVar23 = pcVar23 + -1;
                goto LAB_0037ec2a;
              }
              if (*pcVar23 != '\x01') goto LAB_0037ec2a;
              lVar10 = lVar10 + -1;
              pcVar23 = pcVar23 + 4;
            } while (1 < lVar10);
          }
          pcVar22 = puVar25 + 0x10;
          lVar10 = (long)pcVar28 - (long)pcVar22;
          if (lVar10 == 1) {
LAB_0037ec09:
            pcVar23 = pcVar22;
            if (*pcVar22 == '\x01') {
              pcVar23 = pcVar28;
            }
          }
          else if (lVar10 == 2) {
LAB_0037ec01:
            pcVar23 = pcVar22;
            if (*pcVar22 == '\x01') {
              pcVar22 = pcVar22 + 1;
              goto LAB_0037ec09;
            }
          }
          else {
            pcVar23 = pcVar28;
            if ((lVar10 == 3) && (pcVar23 = pcVar22, *pcVar22 == '\x01')) {
              pcVar22 = puVar25 + 0x11;
              goto LAB_0037ec01;
            }
          }
LAB_0037ec2a:
          if (pcVar23 != pcVar28) {
            (*(local_140->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (local_140,local_148,"unimplemented: partial image updates","","");
          }
        }
        pTVar17 = local_120;
        pTVar31 = local_148;
        local_118 = local_120;
        local_fc = uVar29;
        if ((uVar26 & 1) != 0) {
          iVar4 = (*(local_120->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                            (local_120);
          pHVar27 = local_140;
          pTVar13 = makeInternalVariableNode
                              (local_140,pTVar31,"coordTemp",
                               (TType *)CONCAT44(extraout_var_09,iVar4));
          pTVar18 = local_160;
          pTVar2 = (pHVar27->super_TParseContextBase).super_TParseVersions.intermediate;
          local_f8 = plVar8;
          iVar4 = (*(pTVar13->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                            (pTVar13);
          pTVar14 = TIntermediate::addBinaryNode
                              (pTVar2,EOpAssign,&pTVar13->super_TIntermTyped,
                               &pTVar17->super_TIntermTyped,pTVar31,
                               (TType *)CONCAT44(extraout_var_10,iVar4));
          local_160 = TIntermediate::growAggregate
                                (pTVar2,(TIntermNode *)pTVar18,(TIntermNode *)pTVar14,pTVar31);
          pTVar15 = GetThreadPoolAllocator();
          pTVar16 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar15,0x188);
          TIntermAggregate::TIntermAggregate(pTVar16,EOpImageLoad);
          (*(pTVar16->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [1])(pTVar16,pTVar31);
          iVar4 = (*(pTVar16->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])(pTVar16);
          local_158 = (TIntermSymbol *)local_138;
          std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
          emplace_back<TIntermNode*>
                    ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                     CONCAT44(extraout_var_11,iVar4),(TIntermNode **)&local_158);
          iVar4 = (*(pTVar16->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                    _vptr_TIntermNode[0x32])(pTVar16);
          pTVar2 = (pHVar27->super_TParseContextBase).super_TParseVersions.intermediate;
          local_118 = pTVar13;
          iVar5 = (*(pTVar13->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0xc])(pTVar13)
          ;
          local_158 = TIntermediate::addSymbol
                                (pTVar2,(TIntermSymbol *)CONCAT44(extraout_var_13,iVar5));
          std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::
          emplace_back<TIntermNode*>
                    ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                     CONCAT44(extraout_var_12,iVar4),(TIntermNode **)&local_158);
          (*(pTVar16->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
            [0x1d])(pTVar16,&local_c8);
          pTVar18 = local_160;
          pTVar2 = (pHVar27->super_TParseContextBase).super_TParseVersions.intermediate;
          pTVar11 = TIntermediate::addAssign
                              (pTVar2,EOpAssign,&local_150->super_TIntermTyped,
                               (TIntermTyped *)pTVar16,local_148);
          plVar8 = local_f8;
          pTVar31 = local_148;
          local_160 = TIntermediate::growAggregate
                                (pTVar2,(TIntermNode *)pTVar18,&pTVar11->super_TIntermNode,local_148
                                );
        }
        pHVar27 = local_140;
        pTVar17 = TIntermediate::addSymbol
                            ((local_140->super_TParseContextBase).super_TParseVersions.intermediate,
                             local_150);
        if (plVar8 != (long *)0x0) {
          pTVar2 = (pHVar27->super_TParseContextBase).super_TParseVersions.intermediate;
          op_00 = *(TOperator *)(plVar8 + 0x17);
          pTVar11 = (TIntermTyped *)(**(code **)(*plVar8 + 0x198))(plVar8);
          type = (TType *)(**(code **)(*plVar8 + 0xf0))();
          pTVar17 = (TIntermSymbol *)
                    TIntermediate::addBinaryNode
                              (pTVar2,op_00,&pTVar17->super_TIntermTyped,pTVar11,pTVar31,type);
        }
        pTVar18 = local_160;
        pTVar2 = (pHVar27->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar4 = (*(pTVar17->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar17);
        pTVar14 = TIntermediate::addBinaryNode
                            (pTVar2,(TOperator)local_128,&pTVar17->super_TIntermTyped,
                             (TIntermTyped *)local_f0,pTVar31,
                             (TType *)CONCAT44(extraout_var_14,iVar4));
        local_160 = TIntermediate::growAggregate
                              (pTVar2,(TIntermNode *)pTVar18,(TIntermNode *)pTVar14,pTVar31);
        pTVar17 = local_118;
        uVar29 = local_fc;
      }
      pTVar13 = local_150;
      handleLvalue::anon_class_24_3_d1780b14::operator()
                (&local_e0,local_138,&pTVar17->super_TIntermTyped,local_150);
      pTVar18 = local_160;
      pTVar2 = (local_140->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar17 = TIntermediate::addSymbol(pTVar2,pTVar13);
      local_160 = TIntermediate::growAggregate(pTVar2,(TIntermNode *)pTVar18,(TIntermNode *)pTVar17)
      ;
      (*(local_160->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
        [0x31])(local_160,1);
      (*(local_160->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1]
      )(local_160,local_148);
      (*(local_160->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
        [0x1d])(local_160,&local_c8);
      pTVar18 = local_160;
    }
    if (uVar29 < 0xf) {
      return (TIntermTyped *)pTVar18;
    }
  }
  pHVar27 = local_140;
  pTVar31 = local_148;
  ppTVar24 = local_108;
  pcVar28 = local_110;
  if (local_130 == (HlslParseContext *)0x0) goto LAB_0037f3ee;
  uVar1 = *(uint *)&(local_130->super_TParseContextBase).super_TParseVersions.spvUnsupportedExt.
                    super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                    .
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>,_glslang::pool_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
  if (uVar1 - 0xc < 2) {
    local_130 = (HlslParseContext *)(ulong)uVar1;
    local_128 = makeInternalVariableNode(local_140,local_148,"storeTempPre",&local_c8);
    local_150 = makeInternalVariableNode(pHVar27,pTVar31,"storeTempPost",&local_c8);
    pTVar17 = local_120;
    iVar4 = (*(local_120->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(local_120);
    pTVar13 = makeInternalVariableNode
                        (pHVar27,pTVar31,"coordTemp",(TType *)CONCAT44(extraout_var_21,iVar4));
    pTVar18 = local_160;
    pTVar2 = (pHVar27->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar4 = (*(pTVar13->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar13);
    pTVar14 = TIntermediate::addBinaryNode
                        (pTVar2,EOpAssign,&pTVar13->super_TIntermTyped,&pTVar17->super_TIntermTyped,
                         pTVar31,(TType *)CONCAT44(extraout_var_22,iVar4));
    local_160 = TIntermediate::growAggregate
                          (pTVar2,(TIntermNode *)pTVar18,(TIntermNode *)pTVar14,pTVar31);
    pTVar15 = GetThreadPoolAllocator();
    pTVar16 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar15,0x188);
    TIntermAggregate::TIntermAggregate(pTVar16,EOpImageLoad);
    (*(pTVar16->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
              (pTVar16,pTVar31);
    iVar4 = (*(pTVar16->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])(pTVar16);
    local_158 = (TIntermSymbol *)local_138;
    std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::emplace_back<TIntermNode*>
              ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
               CONCAT44(extraout_var_23,iVar4),(TIntermNode **)&local_158);
    iVar4 = (*(pTVar16->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
              _vptr_TIntermNode[0x32])(pTVar16);
    pTVar2 = (pHVar27->super_TParseContextBase).super_TParseVersions.intermediate;
    local_118 = pTVar13;
    iVar5 = (*(pTVar13->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0xc])(pTVar13);
    local_158 = TIntermediate::addSymbol(pTVar2,(TIntermSymbol *)CONCAT44(extraout_var_25,iVar5));
    std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::emplace_back<TIntermNode*>
              ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
               CONCAT44(extraout_var_24,iVar4),(TIntermNode **)&local_158);
    (*(pTVar16->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[0x1d])
              (pTVar16,&local_c8);
    pTVar13 = local_128;
    pTVar18 = local_160;
    pTVar2 = (pHVar27->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar11 = TIntermediate::addAssign
                        (pTVar2,EOpAssign,&local_128->super_TIntermTyped,(TIntermTyped *)pTVar16,
                         pTVar31);
    pTVar18 = TIntermediate::growAggregate
                        (pTVar2,(TIntermNode *)pTVar18,&pTVar11->super_TIntermNode,pTVar31);
    pTVar17 = local_150;
    pTVar2 = (pHVar27->super_TParseContextBase).super_TParseVersions.intermediate;
    local_160 = pTVar18;
    iVar4 = (*(local_150->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(local_150);
    pTVar14 = TIntermediate::addBinaryNode
                        (pTVar2,EOpAssign,&pTVar17->super_TIntermTyped,&pTVar13->super_TIntermTyped,
                         pTVar31,(TType *)CONCAT44(extraout_var_26,iVar4));
    pTVar18 = TIntermediate::growAggregate
                        (pTVar2,(TIntermNode *)pTVar18,(TIntermNode *)pTVar14,pTVar31);
    pTVar2 = (local_140->super_TParseContextBase).super_TParseVersions.intermediate;
    local_160 = pTVar18;
    pTVar20 = TIntermediate::addSymbol(pTVar2,pTVar17);
    iVar4 = (*(pTVar17->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar17);
    pcVar28 = local_110;
    pTVar19 = TIntermediate::addUnaryNode
                        (pTVar2,(TOperator)local_130,&pTVar20->super_TIntermTyped,pTVar31,
                         (TType *)CONCAT44(extraout_var_27,iVar4));
    local_160 = TIntermediate::growAggregate
                          (pTVar2,(TIntermNode *)pTVar18,(TIntermNode *)pTVar19,pTVar31);
    pTVar20 = local_118;
    pHVar27 = local_140;
LAB_0037f37c:
    handleLvalue::anon_class_24_3_d1780b14::operator()
              (&local_e0,local_138,&pTVar20->super_TIntermTyped,pTVar17);
    pTVar18 = local_160;
    pTVar2 = (pHVar27->super_TParseContextBase).super_TParseVersions.intermediate;
    pTVar17 = TIntermediate::addSymbol(pTVar2,pTVar13);
    ppTVar24 = local_108;
    local_160 = TIntermediate::growAggregate(pTVar2,(TIntermNode *)pTVar18,(TIntermNode *)pTVar17);
    (*(local_160->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
      [0x31])(local_160,1);
    (*(local_160->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
              (local_160,pTVar31);
    (*(local_160->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
      [0x1d])(local_160,&local_c8);
    bVar3 = false;
    pTVar18 = local_160;
  }
  else {
    if (uVar1 - 0xe < 2) {
      local_130 = (HlslParseContext *)(ulong)uVar1;
      local_150 = makeInternalVariableNode(local_140,local_148,"storeTemp",&local_c8);
      pTVar17 = local_120;
      iVar4 = (*(local_120->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])
                        (local_120);
      pTVar13 = makeInternalVariableNode
                          (pHVar27,pTVar31,"coordTemp",(TType *)CONCAT44(extraout_var_15,iVar4));
      pTVar18 = local_160;
      pTVar2 = (pHVar27->super_TParseContextBase).super_TParseVersions.intermediate;
      iVar4 = (*(pTVar13->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar13);
      pTVar14 = TIntermediate::addBinaryNode
                          (pTVar2,EOpAssign,&pTVar13->super_TIntermTyped,
                           &pTVar17->super_TIntermTyped,pTVar31,
                           (TType *)CONCAT44(extraout_var_16,iVar4));
      local_160 = TIntermediate::growAggregate
                            (pTVar2,(TIntermNode *)pTVar18,(TIntermNode *)pTVar14,pTVar31);
      pTVar15 = GetThreadPoolAllocator();
      pTVar16 = (TIntermAggregate *)TPoolAllocator::allocate(pTVar15,0x188);
      TIntermAggregate::TIntermAggregate(pTVar16,EOpImageLoad);
      (*(pTVar16->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode[1])
                (pTVar16,pTVar31);
      iVar4 = (*(pTVar16->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])(pTVar16);
      local_158 = (TIntermSymbol *)local_138;
      std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::emplace_back<TIntermNode*>
                ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                 CONCAT44(extraout_var_17,iVar4),(TIntermNode **)&local_158);
      iVar4 = (*(pTVar16->super_TIntermOperator).super_TIntermTyped.super_TIntermNode.
                _vptr_TIntermNode[0x32])(pTVar16);
      pTVar2 = (pHVar27->super_TParseContextBase).super_TParseVersions.intermediate;
      local_128 = pTVar13;
      iVar5 = (*(pTVar13->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0xc])(pTVar13);
      local_158 = TIntermediate::addSymbol(pTVar2,(TIntermSymbol *)CONCAT44(extraout_var_19,iVar5));
      std::vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>>::emplace_back<TIntermNode*>
                ((vector<TIntermNode*,glslang::pool_allocator<TIntermNode*>> *)
                 CONCAT44(extraout_var_18,iVar4),(TIntermNode **)&local_158);
      (*(pTVar16->super_TIntermOperator).super_TIntermTyped.super_TIntermNode._vptr_TIntermNode
        [0x1d])(pTVar16,&local_c8);
      pTVar17 = local_150;
      pTVar18 = local_160;
      pTVar2 = (pHVar27->super_TParseContextBase).super_TParseVersions.intermediate;
      pTVar11 = TIntermediate::addAssign
                          (pTVar2,EOpAssign,&local_150->super_TIntermTyped,(TIntermTyped *)pTVar16,
                           pTVar31);
      pTVar18 = TIntermediate::growAggregate
                          (pTVar2,(TIntermNode *)pTVar18,&pTVar11->super_TIntermNode,pTVar31);
      pTVar2 = (pHVar27->super_TParseContextBase).super_TParseVersions.intermediate;
      local_160 = pTVar18;
      pTVar13 = TIntermediate::addSymbol(pTVar2,pTVar17);
      iVar4 = (*(pTVar17->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1e])(pTVar17);
      pTVar19 = TIntermediate::addUnaryNode
                          (pTVar2,(TOperator)local_130,&pTVar13->super_TIntermTyped,pTVar31,
                           (TType *)CONCAT44(extraout_var_20,iVar4));
      local_160 = TIntermediate::growAggregate
                            (pTVar2,(TIntermNode *)pTVar18,(TIntermNode *)pTVar19,pTVar31);
      pTVar20 = local_128;
      pTVar13 = pTVar17;
      pcVar28 = local_110;
      goto LAB_0037f37c;
    }
    bVar3 = true;
  }
  if (!bVar3) {
    return (TIntermTyped *)pTVar18;
  }
LAB_0037f3ee:
  iVar4 = (*(pHVar27->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x42])
                    (pHVar27,local_148,pcVar28,local_e8);
  if ((char)iVar4 != '\0') {
    return (TIntermTyped *)0x0;
  }
  return *ppTVar24;
}

Assistant:

TIntermTyped* HlslParseContext::handleLvalue(const TSourceLoc& loc, const char* op, TIntermTyped*& node)
{
    if (node == nullptr)
        return nullptr;

    TIntermBinary* nodeAsBinary = node->getAsBinaryNode();
    TIntermUnary* nodeAsUnary = node->getAsUnaryNode();
    TIntermAggregate* sequence = nullptr;

    TIntermTyped* lhs = nodeAsUnary  ? nodeAsUnary->getOperand() :
                        nodeAsBinary ? nodeAsBinary->getLeft() :
                        nullptr;

    // Early bail out if there is no conversion to apply
    if (!shouldConvertLValue(lhs)) {
        if (lhs != nullptr)
            if (lValueErrorCheck(loc, op, lhs))
                return nullptr;
        return node;
    }

    // *** If we get here, we're going to apply some conversion to an l-value.

    // Helper to create a load.
    const auto makeLoad = [&](TIntermSymbol* rhsTmp, TIntermTyped* object, TIntermTyped* coord, const TType& derefType) {
        TIntermAggregate* loadOp = new TIntermAggregate(EOpImageLoad);
        loadOp->setLoc(loc);
        loadOp->getSequence().push_back(object);
        loadOp->getSequence().push_back(intermediate.addSymbol(*coord->getAsSymbolNode()));
        loadOp->setType(derefType);

        sequence = intermediate.growAggregate(sequence,
                                              intermediate.addAssign(EOpAssign, rhsTmp, loadOp, loc),
                                              loc);
    };

    // Helper to create a store.
    const auto makeStore = [&](TIntermTyped* object, TIntermTyped* coord, TIntermSymbol* rhsTmp) {
        TIntermAggregate* storeOp = new TIntermAggregate(EOpImageStore);
        storeOp->getSequence().push_back(object);
        storeOp->getSequence().push_back(coord);
        storeOp->getSequence().push_back(intermediate.addSymbol(*rhsTmp));
        storeOp->setLoc(loc);
        storeOp->setType(TType(EbtVoid));

        sequence = intermediate.growAggregate(sequence, storeOp);
    };

    // Helper to create an assign.
    const auto makeBinary = [&](TOperator op, TIntermTyped* lhs, TIntermTyped* rhs) {
        sequence = intermediate.growAggregate(sequence,
                                              intermediate.addBinaryNode(op, lhs, rhs, loc, lhs->getType()),
                                              loc);
    };

    // Helper to complete sequence by adding trailing variable, so we evaluate to the right value.
    const auto finishSequence = [&](TIntermSymbol* rhsTmp, const TType& derefType) -> TIntermAggregate* {
        // Add a trailing use of the temp, so the sequence returns the proper value.
        sequence = intermediate.growAggregate(sequence, intermediate.addSymbol(*rhsTmp));
        sequence->setOperator(EOpSequence);
        sequence->setLoc(loc);
        sequence->setType(derefType);

        return sequence;
    };

    // Helper to add unary op
    const auto makeUnary = [&](TOperator op, TIntermSymbol* rhsTmp) {
        sequence = intermediate.growAggregate(sequence,
                                              intermediate.addUnaryNode(op, intermediate.addSymbol(*rhsTmp), loc,
                                                                        rhsTmp->getType()),
                                              loc);
    };

    // Return true if swizzle or index writes all components of the given variable.
    const auto writesAllComponents = [&](TIntermSymbol* var, TIntermBinary* swizzle) -> bool {
        if (swizzle == nullptr)  // not a swizzle or index
            return true;

        // Track which components are being set.
        std::array<bool, 4> compIsSet;
        compIsSet.fill(false);

        const TIntermConstantUnion* asConst     = swizzle->getRight()->getAsConstantUnion();
        const TIntermAggregate*     asAggregate = swizzle->getRight()->getAsAggregate();

        // This could be either a direct index, or a swizzle.
        if (asConst) {
            compIsSet[asConst->getConstArray()[0].getIConst()] = true;
        } else if (asAggregate) {
            const TIntermSequence& seq = asAggregate->getSequence();
            for (int comp=0; comp<int(seq.size()); ++comp)
                compIsSet[seq[comp]->getAsConstantUnion()->getConstArray()[0].getIConst()] = true;
        } else {
            assert(0);
        }

        // Return true if all components are being set by the index or swizzle
        return std::all_of(compIsSet.begin(), compIsSet.begin() + var->getType().getVectorSize(),
                           [](bool isSet) { return isSet; } );
    };

    // Create swizzle matching input swizzle
    const auto addSwizzle = [&](TIntermSymbol* var, TIntermBinary* swizzle) -> TIntermTyped* {
        if (swizzle)
            return intermediate.addBinaryNode(swizzle->getOp(), var, swizzle->getRight(), loc, swizzle->getType());
        else
            return var;
    };

    TIntermBinary*    lhsAsBinary    = lhs->getAsBinaryNode();
    TIntermAggregate* lhsAsAggregate = lhs->getAsAggregate();
    bool lhsIsSwizzle = false;

    // If it's a swizzled L-value, remember the swizzle, and use the LHS.
    if (lhsAsBinary != nullptr && (lhsAsBinary->getOp() == EOpVectorSwizzle || lhsAsBinary->getOp() == EOpIndexDirect)) {
        lhsAsAggregate = lhsAsBinary->getLeft()->getAsAggregate();
        lhsIsSwizzle = true;
    }

    TIntermTyped* object = lhsAsAggregate->getSequence()[0]->getAsTyped();
    TIntermTyped* coord  = lhsAsAggregate->getSequence()[1]->getAsTyped();

    const TSampler& texSampler = object->getType().getSampler();

    TType objDerefType;
    getTextureReturnType(texSampler, objDerefType);

    if (nodeAsBinary) {
        TIntermTyped* rhs = nodeAsBinary->getRight();
        const TOperator assignOp = nodeAsBinary->getOp();

        bool isModifyOp = false;

        switch (assignOp) {
        case EOpAddAssign:
        case EOpSubAssign:
        case EOpMulAssign:
        case EOpVectorTimesMatrixAssign:
        case EOpVectorTimesScalarAssign:
        case EOpMatrixTimesScalarAssign:
        case EOpMatrixTimesMatrixAssign:
        case EOpDivAssign:
        case EOpModAssign:
        case EOpAndAssign:
        case EOpInclusiveOrAssign:
        case EOpExclusiveOrAssign:
        case EOpLeftShiftAssign:
        case EOpRightShiftAssign:
            isModifyOp = true;
            [[fallthrough]];
        case EOpAssign:
            {
                // Since this is an lvalue, we'll convert an image load to a sequence like this
                // (to still provide the value):
                //   OpSequence
                //      OpImageStore(object, lhs, rhs)
                //      rhs
                // But if it's not a simple symbol RHS (say, a fn call), we don't want to duplicate the RHS,
                // so we'll convert instead to this:
                //   OpSequence
                //      rhsTmp = rhs
                //      OpImageStore(object, coord, rhsTmp)
                //      rhsTmp
                // If this is a read-modify-write op, like +=, we issue:
                //   OpSequence
                //      coordtmp = load's param1
                //      rhsTmp = OpImageLoad(object, coordTmp)
                //      rhsTmp op= rhs
                //      OpImageStore(object, coordTmp, rhsTmp)
                //      rhsTmp
                //
                // If the lvalue is swizzled, we apply that when writing the temp variable, like so:
                //    ...
                //    rhsTmp.some_swizzle = ...
                // For partial writes, an error is generated.

                TIntermSymbol* rhsTmp = rhs->getAsSymbolNode();
                TIntermTyped* coordTmp = coord;

                if (rhsTmp == nullptr || isModifyOp || lhsIsSwizzle) {
                    rhsTmp = makeInternalVariableNode(loc, "storeTemp", objDerefType);

                    // Partial updates not yet supported
                    if (!writesAllComponents(rhsTmp, lhsAsBinary)) {
                        error(loc, "unimplemented: partial image updates", "", "");
                    }

                    // Assign storeTemp = rhs
                    if (isModifyOp) {
                        // We have to make a temp var for the coordinate, to avoid evaluating it twice.
                        coordTmp = makeInternalVariableNode(loc, "coordTemp", coord->getType());
                        makeBinary(EOpAssign, coordTmp, coord); // coordtmp = load[param1]
                        makeLoad(rhsTmp, object, coordTmp, objDerefType); // rhsTmp = OpImageLoad(object, coordTmp)
                    }

                    // rhsTmp op= rhs.
                    makeBinary(assignOp, addSwizzle(intermediate.addSymbol(*rhsTmp), lhsAsBinary), rhs);
                }

                makeStore(object, coordTmp, rhsTmp);         // add a store
                return finishSequence(rhsTmp, objDerefType); // return rhsTmp from sequence
            }

        default:
            break;
        }
    }

    if (nodeAsUnary) {
        const TOperator assignOp = nodeAsUnary->getOp();

        switch (assignOp) {
        case EOpPreIncrement:
        case EOpPreDecrement:
            {
                // We turn this into:
                //   OpSequence
                //      coordtmp = load's param1
                //      rhsTmp = OpImageLoad(object, coordTmp)
                //      rhsTmp op
                //      OpImageStore(object, coordTmp, rhsTmp)
                //      rhsTmp

                TIntermSymbol* rhsTmp = makeInternalVariableNode(loc, "storeTemp", objDerefType);
                TIntermTyped* coordTmp = makeInternalVariableNode(loc, "coordTemp", coord->getType());

                makeBinary(EOpAssign, coordTmp, coord);           // coordtmp = load[param1]
                makeLoad(rhsTmp, object, coordTmp, objDerefType); // rhsTmp = OpImageLoad(object, coordTmp)
                makeUnary(assignOp, rhsTmp);                      // op rhsTmp
                makeStore(object, coordTmp, rhsTmp);              // OpImageStore(object, coordTmp, rhsTmp)
                return finishSequence(rhsTmp, objDerefType);      // return rhsTmp from sequence
            }

        case EOpPostIncrement:
        case EOpPostDecrement:
            {
                // We turn this into:
                //   OpSequence
                //      coordtmp = load's param1
                //      rhsTmp1 = OpImageLoad(object, coordTmp)
                //      rhsTmp2 = rhsTmp1
                //      rhsTmp2 op
                //      OpImageStore(object, coordTmp, rhsTmp2)
                //      rhsTmp1 (pre-op value)
                TIntermSymbol* rhsTmp1 = makeInternalVariableNode(loc, "storeTempPre",  objDerefType);
                TIntermSymbol* rhsTmp2 = makeInternalVariableNode(loc, "storeTempPost", objDerefType);
                TIntermTyped* coordTmp = makeInternalVariableNode(loc, "coordTemp", coord->getType());

                makeBinary(EOpAssign, coordTmp, coord);            // coordtmp = load[param1]
                makeLoad(rhsTmp1, object, coordTmp, objDerefType); // rhsTmp1 = OpImageLoad(object, coordTmp)
                makeBinary(EOpAssign, rhsTmp2, rhsTmp1);           // rhsTmp2 = rhsTmp1
                makeUnary(assignOp, rhsTmp2);                      // rhsTmp op
                makeStore(object, coordTmp, rhsTmp2);              // OpImageStore(object, coordTmp, rhsTmp2)
                return finishSequence(rhsTmp1, objDerefType);      // return rhsTmp from sequence
            }

        default:
            break;
        }
    }

    if (lhs)
        if (lValueErrorCheck(loc, op, lhs))
            return nullptr;

    return node;
}